

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture3D(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float *pfVar1;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_28;
  undefined8 local_20;
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar1 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  t = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  texture3D((Functional *)&local_48,c,s,t,*pfVar1,local_18->lod);
  tcu::operator*((tcu *)&local_38,&local_48,&local_18->scale);
  tcu::operator+((tcu *)&local_28,&local_38,&local_18->bias);
  *(undefined8 *)p_local[10].scale.m_data = local_28;
  *(undefined8 *)(p_local[10].scale.m_data + 2) = local_20;
  return;
}

Assistant:

static void		evalTexture3D			(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3D(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), p.lod)*p.scale + p.bias; }